

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildSystemFrontendDelegate::commandProcessFinished
          (BuildSystemFrontendDelegate *this,Command *param_1,ProcessHandle handle,
          ProcessResult *result)

{
  void *pvVar1;
  bool bVar2;
  pointer pvVar3;
  uchar *__ptr;
  size_type __size;
  iterator local_70;
  ConstIterator local_60;
  undefined1 local_50 [8];
  iterator it;
  unique_lock<std::mutex> lock;
  BuildSystemFrontendDelegateImpl *impl;
  ProcessResult *result_local;
  Command *param_1_local;
  BuildSystemFrontendDelegate *this_local;
  ProcessHandle handle_local;
  
  pvVar1 = this->impl;
  this_local = (BuildSystemFrontendDelegate *)handle.id;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&it.End,(mutex_type *)((long)pvVar1 + 0x50));
  _local_50 = llvm::
              DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::find((DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)((long)pvVar1 + 0x38),(const_arg_type_t<unsigned_long>)&this_local);
  local_70 = llvm::
             DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::end((DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)((long)pvVar1 + 0x38));
  llvm::
  DenseMapIterator<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>>,true>
  ::DenseMapIterator<false,void>
            ((DenseMapIterator<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,std::vector<unsigned_char,std::allocator<unsigned_char>>>,true>
              *)&local_60,&local_70);
  bVar2 = llvm::
          DenseMapIterator<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
          ::operator==((DenseMapIterator<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                        *)local_50,&local_60);
  if (!bVar2) {
    pvVar3 = llvm::
             DenseMapIterator<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
             ::operator->((DenseMapIterator<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                           *)local_50);
    __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      (&(pvVar3->
                        super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        ).second);
    pvVar3 = llvm::
             DenseMapIterator<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
             ::operator->((DenseMapIterator<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_false>
                           *)local_50);
    __size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       (&(pvVar3->
                         super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ).second);
    fwrite(__ptr,__size,1,_stdout);
    fflush(_stdout);
    llvm::
    DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::erase((DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)((long)pvVar1 + 0x38),_local_50);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&it.End);
  return;
}

Assistant:

void BuildSystemFrontendDelegate::
commandProcessFinished(Command*, ProcessHandle handle,
                       const ProcessResult& result) {
  auto impl = static_cast<BuildSystemFrontendDelegateImpl*>(this->impl);
  std::unique_lock<std::mutex> lock(impl->processOutputBuffersMutex);

  // If there was an output buffer, flush it.
  auto it = impl->processOutputBuffers.find(handle.id);
  if (it == impl->processOutputBuffers.end())
    return;

  fwrite(it->second.data(), it->second.size(), 1, stdout);
  fflush(stdout);

  impl->processOutputBuffers.erase(it);  
}